

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::SplitBailOnImplicitCall
          (Lowerer *this,Instr *instr,Instr *helperCall,Instr *insertBeforeInstr)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  MemRefOpnd *opnd;
  IntConstOpnd *opnd_00;
  BailOutInfo *bailOutInfo;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  undefined4 *puVar6;
  undefined1 local_70 [8];
  AutoReuseOpnd autoReuseImplicitCallFlags;
  AutoReuseOpnd autoReuseNoImplicitCall;
  
  pFVar1 = this->m_func;
  iVar5 = (*pFVar1->m_threadContextInfo->_vptr_ThreadContextInfo[5])();
  opnd = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar5),TyUint8,pFVar1,AddrOpndKindDynamicMisc);
  local_70 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_70,&opnd->super_Opnd,instr->m_func,true);
  opnd_00 = IR::IntConstOpnd::New(1,TyInt8,this->m_func,true);
  autoReuseImplicitCallFlags.autoDelete = false;
  autoReuseImplicitCallFlags.wasInUse = false;
  autoReuseImplicitCallFlags._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseImplicitCallFlags.autoDelete,&opnd_00->super_Opnd,
             instr->m_func,true);
  InsertMove(&opnd->super_Opnd,&opnd_00->super_Opnd,helperCall->m_prev,true);
  bailOutInfo = IR::Instr::GetBailOutInfo(instr);
  if (bailOutInfo->bailOutInstr == instr) {
    bailOutInfo->bailOutInstr = (Instr *)0x0;
  }
  instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (BailOnNotEqual,BailOutOnImplicitCalls,bailOutInfo,bailOutInfo->bailOutFunc);
  if ((instr_00->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005dac02;
    *puVar6 = 0;
  }
  pFVar1 = (instr_00->super_Instr).m_func;
  if ((opnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_005dac02;
    *puVar6 = 0;
  }
  bVar4 = (opnd->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    opnd = (MemRefOpnd *)IR::Opnd::Copy(&opnd->super_Opnd,pFVar1);
    bVar4 = (opnd->super_Opnd).field_0xb;
  }
  (opnd->super_Opnd).field_0xb = bVar4 | 2;
  (instr_00->super_Instr).m_src1 = &opnd->super_Opnd;
  if ((instr_00->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005dac02;
    *puVar6 = 0;
  }
  pFVar1 = (instr_00->super_Instr).m_func;
  if ((opnd_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005dac02:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar4 = (opnd_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    opnd_00 = (IntConstOpnd *)IR::Opnd::Copy(&opnd_00->super_Opnd,pFVar1);
    bVar4 = (opnd_00->super_Opnd).field_0xb;
  }
  (opnd_00->super_Opnd).field_0xb = bVar4 | 2;
  (instr_00->super_Instr).m_src2 = &opnd_00->super_Opnd;
  IR::Instr::InsertBefore(insertBeforeInstr,&instr_00->super_Instr);
  IR::Instr::ClearBailOutInfo(instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseImplicitCallFlags.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_70);
  return &instr_00->super_Instr;
}

Assistant:

IR::Instr *
Lowerer::SplitBailOnImplicitCall(IR::Instr * instr, IR::Instr * helperCall, IR::Instr * insertBeforeInstr)
{
    IR::Opnd * implicitCallFlags = this->GetImplicitCallFlagsOpnd();
    const IR::AutoReuseOpnd autoReuseImplicitCallFlags(implicitCallFlags, instr->m_func);
    IR::IntConstOpnd * noImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_None, TyInt8, this->m_func, true);
    const IR::AutoReuseOpnd autoReuseNoImplicitCall(noImplicitCall, instr->m_func);

    // Reset the implicit call flag on every helper call
    Lowerer::InsertMove(implicitCallFlags, noImplicitCall, helperCall->m_prev);

    BailOutInfo * bailOutInfo = instr->GetBailOutInfo();
    if (bailOutInfo->bailOutInstr == instr)
    {
        bailOutInfo->bailOutInstr = nullptr;
    }
    IR::Instr * bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, IR::BailOutOnImplicitCalls, bailOutInfo, bailOutInfo->bailOutFunc);
    bailOutInstr->SetSrc1(implicitCallFlags);
    bailOutInstr->SetSrc2(noImplicitCall);

    insertBeforeInstr->InsertBefore(bailOutInstr);
    instr->ClearBailOutInfo();
    return bailOutInstr;
}